

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerBailOnIntMin
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  LabelInstr *target;
  Opnd *compareSrc1;
  IntConstOpnd *compareSrc2;
  Lowerer *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x32ff,"(instr)","instr");
    if (!bVar2) goto LAB_005e3596;
    *puVar5 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3300,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_005e3596;
    *puVar5 = 0;
  }
  target = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  if ((instr->field_0x38 & 0x10) != 0) {
    BVar4 = IR::Instr::GetBailOutKind(instr);
    if (BVar4 != BailOnIntMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x330a,"(instr->GetBailOutKind() == IR::BailOnIntMin)",
                         "instr->GetBailOutKind() == IR::BailOnIntMin");
      if (!bVar2) goto LAB_005e3596;
      *puVar5 = 0;
    }
    OVar3 = IR::Opnd::GetKind(instr->m_src1);
    compareSrc1 = IR::Instr::UnlinkSrc1(instr);
    if (OVar3 != OpndKindIntConst) {
      this_00 = (Lowerer *)0xffffffff80000000;
      compareSrc2 = IR::IntConstOpnd::New(-0x80000000,TyInt32,this->m_func,false);
      InsertCompareBranch(this_00,compareSrc1,&compareSrc2->super_Opnd,BrNeq_A,false,target,instr,
                          false);
      GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
      return &target->super_Instr;
    }
    OVar3 = IR::Opnd::GetKind(compareSrc1);
    if (OVar3 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar2) {
LAB_005e3596:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (compareSrc1[1]._vptr_Opnd == (_func_int **)0xffffffff80000000) {
      GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
      IR::Opnd::Free(compareSrc1,instr->m_func);
      return &target->super_Instr;
    }
  }
  IR::Instr::Remove(instr);
  return &target->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnIntMin(IR::Instr *instr, IR::BranchInstr *branchInstr  /* = nullptr */, IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    Assert(instr);
    Assert(instr->GetSrc1());
    IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    instr->InsertAfter(continueLabelInstr);

    if(!instr->HasBailOutInfo())
    {
        instr->Remove();
    }
    else
    {
        Assert(instr->GetBailOutKind() == IR::BailOnIntMin);
        // Note: src1 must be int32 at this point.
        if (instr->GetSrc1()->IsIntConstOpnd())
        {
            // For consts we can check the value at JIT time. Note: without this check we'll have to legalize the CMP instr.
            IR::IntConstOpnd* intConst = instr->UnlinkSrc1()->AsIntConstOpnd();
            if (intConst->GetValue() == INT_MIN)
            {
                this->GenerateBailOut(instr, branchInstr, labelBailOut);
                intConst->Free(instr->m_func);
            }
            else
            {
                instr->Remove();
            }
        }
        else
        {
            InsertCompareBranch(instr->UnlinkSrc1(), IR::IntConstOpnd::New(INT_MIN, TyInt32, this->m_func), Js::OpCode::BrNeq_A, continueLabelInstr, instr);
            this->GenerateBailOut(instr, branchInstr, labelBailOut);
        }
    }

    return continueLabelInstr;
}